

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void RenderText(Shader *shader,char *text,GLfloat x,GLfloat y,GLfloat scale,vec3 color)

{
  bool bVar1;
  reference pwVar2;
  mapped_type *pmVar3;
  float fVar4;
  float fVar5;
  float local_1b8;
  float local_1b4;
  GLfloat vertices [6] [4];
  GLfloat h;
  GLfloat w;
  GLfloat ypos;
  GLfloat xpos;
  undefined8 uStack_138;
  Character ch;
  __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  _Stack_118;
  wchar_t c;
  iterator __end1;
  iterator __begin1;
  wide_string *__range1;
  string local_f8 [48];
  undefined1 local_c8 [8];
  wide_string str32;
  wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
  cv;
  GLfloat scale_local;
  GLfloat y_local;
  GLfloat x_local;
  char *text_local;
  Shader *shader_local;
  anon_union_4_3_4e90da17_for_tvec3<float,_(glm::precision)0>_2 local_18;
  anon_union_4_3_4e90b0ec_for_tvec3<float,_(glm::precision)0>_4 aStack_14;
  vec3 color_local;
  
  cv._92_4_ = scale;
  std::__cxx11::
  wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
  ::wstring_convert((wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
                     *)&stack0xffffffffffffff58);
  std::__cxx11::
  wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
  ::from_bytes((wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
                *)local_c8,(char *)&stack0xffffffffffffff58);
  Shader::use(shader);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,"textColor",(allocator *)((long)&__range1 + 7));
  local_18 = color.field_0;
  aStack_14 = color.field_1;
  Shader::setVec3(shader,(string *)local_f8,local_18.x,aStack_14.y,color.field_2.z);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
  (*glad_glActiveTexture)(0x84c0);
  (*glad_glBindVertexArray)(VAO);
  __end1._M_current = (wchar_t *)std::__cxx11::wstring::begin();
  _Stack_118._M_current = (wchar_t *)std::__cxx11::wstring::end();
  scale_local = x;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xfffffffffffffee8);
    if (!bVar1) break;
    pwVar2 = __gnu_cxx::
             __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
             ::operator*(&__end1);
    ch.Advance = *pwVar2;
    _ypos = (ulong)ch.Advance;
    pmVar3 = std::
             map<unsigned_long,_Character,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Character>_>_>
             ::operator[](&Characters,(key_type *)&ypos);
    ch._8_8_ = *(undefined8 *)&(pmVar3->Bearing).field_1;
    uStack_138._0_4_ = pmVar3->TextureID;
    uStack_138._4_4_ = (pmVar3->Size).field_0;
    ch._0_8_ = *(undefined8 *)&(pmVar3->Size).field_1;
    local_1b8 = (float)ch.Size.field_0.x * (float)cv._92_4_ + scale_local;
    vertices[0][3] = y - (float)(int)(ch.TextureID - ch.Size.field_1.y) * (float)cv._92_4_;
    fVar4 = (float)(int)uStack_138._4_4_ * (float)cv._92_4_;
    fVar5 = (float)(int)ch.TextureID * (float)cv._92_4_;
    local_1b4 = vertices[0][3] + fVar5;
    vertices[0][0] = 0.0;
    vertices[0][1] = 0.0;
    vertices[1][0] = 0.0;
    vertices[1][1] = 1.0;
    vertices[1][2] = local_1b8 + fVar4;
    vertices[2][0] = 1.0;
    vertices[2][1] = 1.0;
    vertices[2][3] = vertices[0][3] + fVar5;
    vertices[3][0] = 0.0;
    vertices[3][1] = 0.0;
    vertices[3][2] = local_1b8 + fVar4;
    vertices[4][0] = 1.0;
    vertices[4][1] = 1.0;
    vertices[4][2] = local_1b8 + fVar4;
    vertices[4][3] = vertices[0][3] + fVar5;
    vertices[5][0] = 1.0;
    vertices[5][1] = 0.0;
    vertices[0][2] = local_1b8;
    vertices[1][3] = vertices[0][3];
    vertices[2][2] = local_1b8;
    vertices[3][3] = vertices[0][3];
    (*glad_glBindTexture)(0xde1,(undefined4)uStack_138);
    (*glad_glBindBuffer)(0x8892,VBO);
    (*glad_glBufferSubData)(0x8892,0,0x60,&local_1b8);
    (*glad_glBindBuffer)(0x8892,0);
    (*glad_glDrawArrays)(4,0,6);
    scale_local = (float)((uint)ch.Bearing.field_0.x >> 6) * (float)cv._92_4_ + scale_local;
    __gnu_cxx::
    __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
    ::operator++(&__end1);
  }
  (*glad_glBindVertexArray)(0);
  (*glad_glBindTexture)(0xde1,0);
  std::__cxx11::wstring::~wstring((wstring *)local_c8);
  std::__cxx11::
  wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
  ::~wstring_convert((wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
                      *)&stack0xffffffffffffff58);
  return;
}

Assistant:

void RenderText(Shader &shader, const char text[], GLfloat x, GLfloat y, GLfloat scale, glm::vec3 color) {
    std::wstring_convert<std::codecvt_utf8<wchar_t>, wchar_t> cv;
    auto str32 = cv.from_bytes(text);

    // Activate corresponding render state	
    shader.use();
    //glUniform3f(glGetUniformLocation(shader.Program, "textColor"), color.x, color.y, color.z);
	shader.setVec3("textColor", color.x, color.y, color.z);

    glActiveTexture(GL_TEXTURE0);
    glBindVertexArray(VAO);

    // Iterate through all characters
    //std::wstring::const_iterator c;
    //for (int i = 0; i < sizeof(text) / sizeof(const char*); ++i) {

    for(auto c : str32) {
        Character ch = Characters[uint_least32_t(c)];

        GLfloat xpos = x + ch.Bearing.x * scale;
        GLfloat ypos = y - (ch.Size.y - ch.Bearing.y) * scale;

        GLfloat w = ch.Size.x * scale;
        GLfloat h = ch.Size.y * scale;
        // Update VBO for each character
        GLfloat vertices[6][4] = {
            { xpos,     ypos + h,   0.0, 0.0 },            
            { xpos,     ypos,       0.0, 1.0 },
            { xpos + w, ypos,       1.0, 1.0 },

            { xpos,     ypos + h,   0.0, 0.0 },
            { xpos + w, ypos,       1.0, 1.0 },
            { xpos + w, ypos + h,   1.0, 0.0 }           
        };
        // Render glyph texture over quad
        glBindTexture(GL_TEXTURE_2D, ch.TextureID);
        // Update content of VBO memory
        glBindBuffer(GL_ARRAY_BUFFER, VBO);
        glBufferSubData(GL_ARRAY_BUFFER, 0, sizeof(vertices), vertices); // Be sure to use glBufferSubData and not glBufferData

        glBindBuffer(GL_ARRAY_BUFFER, 0);
        // Render quad
        glDrawArrays(GL_TRIANGLES, 0, 6);
        // Now advance cursors for next glyph (note that advance is number of 1/64 pixels)
        x += (ch.Advance >> 6) * scale; // Bitshift by 6 to get value in pixels (2^6 = 64 (divide amount of 1/64th pixels by 64 to get amount of pixels))
    }
    glBindVertexArray(0);
    glBindTexture(GL_TEXTURE_2D, 0);
}